

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 float32_log2_ppc(float32 a,float_status *status)

{
  float32 fVar1;
  ulong uVar2;
  uint local_2c;
  uint local_28;
  uint32_t i;
  uint32_t zSig;
  uint32_t aSig;
  int aExp;
  flag zSign;
  flag aSign;
  float_status *status_local;
  float32 a_local;
  
  _aExp = status;
  status_local._0_4_ = a;
  status_local._0_4_ = float32_squash_input_denormal_ppc(a,status);
  i = extractFloat32Frac((float32)status_local);
  zSig = extractFloat32Exp((float32)status_local);
  aSig._3_1_ = extractFloat32Sign((float32)status_local);
  if (zSig == 0) {
    if (i == 0) {
      fVar1 = packFloat32('\x01',0xff,0);
      return fVar1;
    }
    normalizeFloat32Subnormal(i,(int *)&zSig,&i);
  }
  if (aSig._3_1_ == '\0') {
    if (zSig == 0xff) {
      if (i == 0) {
        status_local._4_4_ = (float32)status_local;
      }
      else {
        status_local._4_4_ = propagateFloat32NaN((float32)status_local,0,_aExp);
      }
    }
    else {
      zSig = zSig - 0x7f;
      i = i | 0x800000;
      aSig._2_1_ = (int)zSig < 0;
      local_28 = zSig * 0x800000;
      for (local_2c = 0x400000; local_2c != 0; local_2c = local_2c >> 1) {
        uVar2 = (ulong)i * (ulong)i >> 0x17;
        i = (uint32_t)uVar2;
        if ((uVar2 & 0x1000000) != 0) {
          i = i >> 1;
          local_28 = local_2c | local_28;
        }
      }
      if ((bool)aSig._2_1_) {
        local_28 = -local_28;
      }
      status_local._4_4_ = normalizeRoundAndPackFloat32(aSig._2_1_,0x85,local_28,_aExp);
    }
  }
  else {
    float_raise_ppc('\x01',_aExp);
    status_local._4_4_ = float32_default_nan_ppc(_aExp);
  }
  return status_local._4_4_;
}

Assistant:

float32 float32_log2(float32 a, float_status *status)
{
    flag aSign, zSign;
    int aExp;
    uint32_t aSig, zSig, i;

    a = float32_squash_input_denormal(a, status);
    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );

    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat32( 1, 0xFF, 0 );
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
    }
    if ( aSign ) {
        float_raise(float_flag_invalid, status);
        return float32_default_nan(status);
    }
    if ( aExp == 0xFF ) {
        if (aSig) {
            return propagateFloat32NaN(a, float32_zero, status);
        }
        return a;
    }

    aExp -= 0x7F;
    aSig |= 0x00800000;
    zSign = aExp < 0;
    zSig = aExp << 23;

    for (i = 1 << 22; i > 0; i >>= 1) {
        aSig = ( (uint64_t)aSig * aSig ) >> 23;
        if ( aSig & 0x01000000 ) {
            aSig >>= 1;
            zSig |= i;
        }
    }

    if ( zSign )
#ifdef _MSC_VER
        zSig = 0 - zSig;
#else
        zSig = -zSig;
#endif

    return normalizeRoundAndPackFloat32(zSign, 0x85, zSig, status);
}